

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::VertexShaderTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,VertexShaderTestInstance *this,VkQueryPool queryPool)

{
  VkQueryPipelineStatisticFlags VVar1;
  VkPrimitiveTopology VVar2;
  ParametersGraphic *pPVar3;
  bool bVar4;
  VkResult result_00;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long *local_60;
  long local_58;
  long local_50 [2];
  deUint64 local_40;
  deUint64 result;
  
  local_40 = queryPool.m_internal;
  pDVar5 = Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  pVVar6 = Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  result = 0;
  pPVar3 = (this->super_GraphicBasicTestInstance).m_parametersGraphic;
  VVar1 = pPVar3->queryStatisticFlags;
  uVar9 = 0;
  if ((int)VVar1 < 4) {
    if (VVar1 == 1) {
      uVar8 = 0x10;
      uVar9 = 0x10;
    }
    else {
      uVar8 = 0;
      if (VVar1 == 2) {
        VVar2 = pPVar3->primitiveTopology;
        if ((ulong)VVar2 < 9) {
          uVar8 = *(ulong *)(&DAT_00b05980 + (ulong)VVar2 * 8);
          uVar9 = *(ulong *)(&DAT_00b05980 + (ulong)VVar2 * 8);
        }
        else {
          uVar8 = 6;
          uVar9 = 6;
          if (VVar2 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY) {
            uVar8 = 0;
            uVar9 = 0;
          }
        }
      }
    }
  }
  else if (VVar1 == 4) {
    VVar2 = pPVar3->primitiveTopology;
    uVar7 = VVar2 - VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    if ((uVar7 < 6) && ((0x39U >> (uVar7 & 0x1f) & 1) != 0)) {
      uVar8 = *(ulong *)(&DAT_00b05950 + (ulong)uVar7 * 8);
    }
    else {
      uVar8 = (ulong)(VVar2 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY) * 8 + 8;
    }
    uVar9 = (ulong)(VVar2 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY) * 4 + 0xc;
  }
  else {
    uVar8 = 0;
    if (VVar1 == 0x80) {
      VVar2 = pPVar3->primitiveTopology;
      if ((ulong)VVar2 < 9) {
        uVar8 = *(ulong *)(&DAT_00b059c8 + (ulong)VVar2 * 8);
      }
      else {
        uVar8 = 0xc00;
        if (VVar2 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY) {
          uVar8 = 0;
        }
      }
      uVar9 = uVar8 * 4;
    }
  }
  result_00 = (*pDVar5->_vptr_DeviceInterface[0x20])(pDVar5,pVVar6,local_40,0,1,8,&result,0,1);
  ::vk::checkResult(result_00,
                    "vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x451);
  if ((result < uVar8) || (uVar9 < result)) {
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"QueryPoolResults incorrect","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_60,local_58 + (long)local_60);
  }
  else if ((((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology !=
            VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) ||
          (bVar4 = GraphicBasicTestInstance::checkImage(&this->super_GraphicBasicTestInstance),
          bVar4)) {
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_60,local_58 + (long)local_60);
  }
  else {
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Result image doesn\'t match expected image.","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_60,local_58 + (long)local_60);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus VertexShaderTestInstance::checkResult (VkQueryPool queryPool)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	deUint64				result		= 0u;
	deUint64				expectedMin	= 0u;
	deUint64				expectedMax	= 0u;
	switch(m_parametersGraphic.queryStatisticFlags)
	{
		case VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_VERTICES_BIT:
			expectedMax = expectedMin = 16u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_VERTEX_SHADER_INVOCATIONS_BIT:
			expectedMin =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					? 15u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			?  8u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		? 14u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		?  6u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	?  8u :
							16u;
			expectedMax =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		? 12u : 16u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_INPUT_ASSEMBLY_PRIMITIVES_BIT:
			expectedMax = expectedMin =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST						? 16u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST						?  8u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP						? 15u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					?  5u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP					?  8u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN						? 14u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			?  4u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		? 13u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		?  2u :
										m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	?  6u :
										0u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_FRAGMENT_SHADER_INVOCATIONS_BIT:
			expectedMin =	m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST						?     9u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST						?   192u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP						?   448u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST					?  2016u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP					?  4096u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN						? 10208u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY			?   128u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY		?   416u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY		?   992u :
							m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY	?  3072u :
							0u;
			expectedMax = 4u * expectedMin;
			break;
		default:
			DE_ASSERT(0);
			break;
	}

	VK_CHECK(vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT));
	if (result < expectedMin || result > expectedMax)
		return tcu::TestStatus::fail("QueryPoolResults incorrect");

	if (m_parametersGraphic.primitiveTopology == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP && !checkImage())
		return tcu::TestStatus::fail("Result image doesn't match expected image.");

	return tcu::TestStatus::pass("Pass");
}